

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *ilimit_w;
  ZSTD_compressionParameters *cParams_00;
  ulong *iEnd;
  ulong *puVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  seqDef *psVar12;
  bool bVar13;
  undefined8 uVar14;
  int iVar15;
  uint uVar16;
  U32 UVar17;
  size_t sVar18;
  BYTE *pBVar19;
  ulong uVar20;
  BYTE *pBVar21;
  uint uVar22;
  ulong *puVar23;
  ulong *puVar24;
  BYTE *pBVar25;
  ulong *puVar26;
  ulong *puVar27;
  BYTE *pBVar28;
  long lVar29;
  U32 UVar30;
  ulong uVar31;
  uint uVar32;
  int iVar33;
  BYTE *iStart;
  ulong *puVar34;
  ulong uVar35;
  U32 UVar36;
  uint uVar37;
  uint uVar38;
  U32 UVar39;
  ZSTD_compressionParameters *cParams;
  ulong local_130;
  ulong local_128;
  BYTE *local_108;
  ulong *local_d8;
  BYTE *local_d0;
  int local_9c;
  ulong *local_78;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar9 = (ms->window).base;
  uVar6 = (ms->window).dictLimit;
  iStart = pBVar9 + uVar6;
  UVar39 = *rep;
  UVar36 = rep[1];
  puVar34 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  local_d8 = (ulong *)src;
  if (puVar34 < puVar4) {
    pBVar10 = (ms->window).dictBase;
    uVar7 = (ms->window).lowLimit;
    puVar26 = (ulong *)(pBVar10 + uVar6);
    iVar15 = uVar6 - 1;
    cParams_00 = &ms->cParams;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    ilimit_w = iEnd + -4;
    do {
      iVar33 = (int)puVar34;
      local_9c = iVar33 - (int)pBVar9;
      uVar16 = (local_9c - UVar39) + 1;
      pBVar25 = pBVar9;
      if (uVar16 < uVar6) {
        pBVar25 = pBVar10;
      }
      if ((uVar7 < uVar16 && 2 < iVar15 - uVar16) &&
         (*(int *)((long)puVar34 + 1) == *(int *)(pBVar25 + uVar16))) {
        puVar23 = iEnd;
        if (uVar16 < uVar6) {
          puVar23 = puVar26;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar34 + 5),(BYTE *)((long)(pBVar25 + uVar16) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar23,iStart);
        local_d0 = (BYTE *)(sVar18 + 4);
      }
      else {
        local_d0 = (BYTE *)0x0;
      }
      uVar16 = (ms->cParams).minMatch;
      if (uVar16 - 6 < 2) {
        uVar37 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar25 = (ms->window).base;
        uVar32 = iVar33 - (int)pBVar25;
        uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar17 = (ms->window).lowLimit;
        UVar30 = uVar32 - uVar16;
        if (uVar32 - UVar17 <= uVar16) {
          UVar30 = UVar17;
        }
        pUVar11 = ms->chainTable;
        pBVar21 = (ms->window).dictBase;
        uVar16 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          UVar30 = UVar17;
        }
        uVar22 = uVar32 - uVar37;
        if (uVar32 < uVar37) {
          uVar22 = 0;
        }
        uVar38 = (ms->cParams).searchLog;
        UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar34,6);
        if (UVar17 <= UVar30) goto LAB_00129250;
        iVar33 = 1 << ((byte)uVar38 & 0x1f);
        local_128 = 999999999;
        pBVar28 = (BYTE *)0x3;
        do {
          if (UVar17 < uVar16) {
            if (pBVar21 + uVar16 < pBVar21 + (ulong)UVar17 + 4) {
LAB_0012a024:
              __assert_fail("match+4 <= dictEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x40dd,
                            "size_t ZSTD_HcFindBestMatch_generic(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                           );
            }
            if (*(int *)(pBVar21 + UVar17) == (int)*puVar34) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar34 + 4),pBVar21 + (ulong)UVar17 + 4,
                                  (BYTE *)iEnd,pBVar21 + uVar16,pBVar25 + uVar16);
              pBVar19 = (BYTE *)(sVar18 + 4);
            }
            else {
LAB_00128c6a:
              pBVar19 = (BYTE *)0x0;
            }
          }
          else {
            puVar23 = (ulong *)(pBVar25 + UVar17);
            if (pBVar28[(long)puVar23] != *(BYTE *)((long)puVar34 + (long)pBVar28))
            goto LAB_00128c6a;
            puVar24 = puVar34;
            if (puVar34 < puVar1) {
              uVar20 = *puVar34 ^ *puVar23;
              uVar31 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              pBVar19 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
              if (*puVar23 == *puVar34) {
                do {
                  puVar24 = puVar24 + 1;
                  puVar23 = puVar23 + 1;
                  if (puVar1 <= puVar24) goto LAB_00128c71;
                  uVar20 = *puVar24 ^ *puVar23;
                  uVar31 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  pBVar19 = (BYTE *)((long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar34));
                } while (*puVar23 == *puVar24);
              }
            }
            else {
LAB_00128c71:
              if ((puVar24 < puVar2) && ((int)*puVar23 == (int)*puVar24)) {
                puVar24 = (ulong *)((long)puVar24 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar24 < puVar3) && ((short)*puVar23 == (short)*puVar24)) {
                puVar24 = (ulong *)((long)puVar24 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar24 < iEnd) {
                puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar24));
              }
              pBVar19 = (BYTE *)((long)puVar24 - (long)puVar34);
            }
          }
          if ((pBVar28 < pBVar19) &&
             (local_128 = (ulong)((uVar32 + 2) - UVar17), pBVar28 = pBVar19,
             (ulong *)((long)puVar34 + (long)pBVar19) == iEnd)) {
            bVar13 = false;
          }
          else {
            pBVar19 = pBVar28;
            if (uVar22 < UVar17) {
              UVar17 = pUVar11[UVar17 & uVar37 - 1];
              bVar13 = true;
            }
            else {
              bVar13 = false;
            }
          }
        } while (((bVar13) && (UVar30 < UVar17)) &&
                (iVar33 = iVar33 + -1, pBVar28 = pBVar19, iVar33 != 0));
      }
      else if (uVar16 == 5) {
        uVar22 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar25 = (ms->window).base;
        uVar38 = iVar33 - (int)pBVar25;
        uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar16 = (ms->window).lowLimit;
        uVar32 = uVar38 - uVar37;
        if (uVar38 - uVar16 <= uVar37) {
          uVar32 = uVar16;
        }
        pUVar11 = ms->chainTable;
        pBVar21 = (ms->window).dictBase;
        uVar37 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          uVar32 = uVar16;
        }
        uVar16 = uVar38 - uVar22;
        if (uVar38 < uVar22) {
          uVar16 = 0;
        }
        uVar8 = (ms->cParams).searchLog;
        UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar34,5);
        if (uVar32 < UVar17) {
          iVar33 = 1 << ((byte)uVar8 & 0x1f);
          local_128 = 999999999;
          pBVar28 = (BYTE *)0x3;
          do {
            if (UVar17 < uVar37) {
              if (pBVar21 + uVar37 < pBVar21 + (ulong)UVar17 + 4) goto LAB_0012a024;
              if (*(int *)(pBVar21 + UVar17) == (int)*puVar34) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar34 + 4),pBVar21 + (ulong)UVar17 + 4,
                                    (BYTE *)iEnd,pBVar21 + uVar37,pBVar25 + uVar37);
                pBVar19 = (BYTE *)(sVar18 + 4);
              }
              else {
LAB_00128f0e:
                pBVar19 = (BYTE *)0x0;
              }
            }
            else {
              puVar23 = (ulong *)(pBVar25 + UVar17);
              if (pBVar28[(long)puVar23] != *(BYTE *)((long)puVar34 + (long)pBVar28))
              goto LAB_00128f0e;
              puVar24 = puVar34;
              if (puVar34 < puVar1) {
                uVar20 = *puVar34 ^ *puVar23;
                uVar31 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                pBVar19 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
                if (*puVar23 == *puVar34) {
                  do {
                    puVar24 = puVar24 + 1;
                    puVar23 = puVar23 + 1;
                    if (puVar1 <= puVar24) goto LAB_00128f15;
                    uVar20 = *puVar24 ^ *puVar23;
                    uVar31 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                      }
                    }
                    pBVar19 = (BYTE *)((long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar34))
                    ;
                  } while (*puVar23 == *puVar24);
                }
              }
              else {
LAB_00128f15:
                if ((puVar24 < puVar2) && ((int)*puVar23 == (int)*puVar24)) {
                  puVar24 = (ulong *)((long)puVar24 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar24 < puVar3) && ((short)*puVar23 == (short)*puVar24)) {
                  puVar24 = (ulong *)((long)puVar24 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar24 < iEnd) {
                  puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar24));
                }
                pBVar19 = (BYTE *)((long)puVar24 - (long)puVar34);
              }
            }
            if ((pBVar28 < pBVar19) &&
               (local_128 = (ulong)((uVar38 + 2) - UVar17), pBVar28 = pBVar19,
               (ulong *)((long)puVar34 + (long)pBVar19) == iEnd)) {
              bVar13 = false;
            }
            else {
              pBVar19 = pBVar28;
              if (uVar16 < UVar17) {
                UVar17 = pUVar11[UVar17 & uVar22 - 1];
                bVar13 = true;
              }
              else {
                bVar13 = false;
              }
            }
          } while (((bVar13) && (uVar32 < UVar17)) &&
                  (iVar33 = iVar33 + -1, pBVar28 = pBVar19, iVar33 != 0));
        }
        else {
LAB_00129250:
          pBVar19 = (BYTE *)0x3;
          local_128 = 999999999;
        }
      }
      else {
        uVar22 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar25 = (ms->window).base;
        uVar38 = iVar33 - (int)pBVar25;
        uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar16 = (ms->window).lowLimit;
        uVar32 = uVar38 - uVar37;
        if (uVar38 - uVar16 <= uVar37) {
          uVar32 = uVar16;
        }
        pUVar11 = ms->chainTable;
        pBVar21 = (ms->window).dictBase;
        uVar37 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          uVar32 = uVar16;
        }
        uVar16 = uVar38 - uVar22;
        if (uVar38 < uVar22) {
          uVar16 = 0;
        }
        uVar8 = (ms->cParams).searchLog;
        UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar34,4);
        if (UVar17 <= uVar32) goto LAB_00129250;
        iVar33 = 1 << ((byte)uVar8 & 0x1f);
        local_128 = 999999999;
        pBVar28 = (BYTE *)0x3;
        do {
          if (UVar17 < uVar37) {
            if (pBVar21 + uVar37 < pBVar21 + (ulong)UVar17 + 4) goto LAB_0012a024;
            if (*(int *)(pBVar21 + UVar17) == (int)*puVar34) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar34 + 4),pBVar21 + (ulong)UVar17 + 4,
                                  (BYTE *)iEnd,pBVar21 + uVar37,pBVar25 + uVar37);
              pBVar19 = (BYTE *)(sVar18 + 4);
            }
            else {
LAB_001291aa:
              pBVar19 = (BYTE *)0x0;
            }
          }
          else {
            puVar23 = (ulong *)(pBVar25 + UVar17);
            if (pBVar28[(long)puVar23] != *(BYTE *)((long)puVar34 + (long)pBVar28))
            goto LAB_001291aa;
            puVar24 = puVar34;
            if (puVar34 < puVar1) {
              uVar20 = *puVar34 ^ *puVar23;
              uVar31 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              pBVar19 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
              if (*puVar23 == *puVar34) {
                do {
                  puVar24 = puVar24 + 1;
                  puVar23 = puVar23 + 1;
                  if (puVar1 <= puVar24) goto LAB_001291b1;
                  uVar20 = *puVar24 ^ *puVar23;
                  uVar31 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  pBVar19 = (BYTE *)((long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar34));
                } while (*puVar23 == *puVar24);
              }
            }
            else {
LAB_001291b1:
              if ((puVar24 < puVar2) && ((int)*puVar23 == (int)*puVar24)) {
                puVar24 = (ulong *)((long)puVar24 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar24 < puVar3) && ((short)*puVar23 == (short)*puVar24)) {
                puVar24 = (ulong *)((long)puVar24 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar24 < iEnd) {
                puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar24));
              }
              pBVar19 = (BYTE *)((long)puVar24 - (long)puVar34);
            }
          }
          if ((pBVar28 < pBVar19) &&
             (local_128 = (ulong)((uVar38 + 2) - UVar17), pBVar28 = pBVar19,
             (ulong *)((long)puVar34 + (long)pBVar19) == iEnd)) {
            bVar13 = false;
          }
          else {
            pBVar19 = pBVar28;
            if (uVar16 < UVar17) {
              UVar17 = pUVar11[UVar17 & uVar22 - 1];
              bVar13 = true;
            }
            else {
              bVar13 = false;
            }
          }
        } while (((bVar13) && (uVar32 < UVar17)) &&
                (iVar33 = iVar33 + -1, pBVar28 = pBVar19, iVar33 != 0));
      }
      local_108 = local_d0;
      if (local_d0 < pBVar19) {
        local_108 = pBVar19;
      }
      if (local_108 < (BYTE *)0x4) {
        puVar34 = (ulong *)((long)puVar34 + ((long)puVar34 - (long)local_d8 >> 8) + 1);
      }
      else {
        local_78 = puVar34;
        if (pBVar19 <= local_d0) {
          local_128 = 0;
          local_78 = (ulong *)((long)puVar34 + 1);
        }
        do {
          if (puVar4 <= puVar34) break;
          puVar23 = (ulong *)((long)puVar34 + 1);
          local_9c = local_9c + 1;
          if (local_128 == 0) {
            local_128 = 0;
          }
          else {
            uVar16 = local_9c - UVar39;
            pBVar25 = pBVar9;
            if (uVar16 < uVar6) {
              pBVar25 = pBVar10;
            }
            if ((uVar7 < uVar16 && 2 < iVar15 - uVar16) &&
               (*(int *)puVar23 == *(int *)(pBVar25 + uVar16))) {
              puVar24 = iEnd;
              if (uVar16 < uVar6) {
                puVar24 = puVar26;
              }
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar34 + 5),(BYTE *)((long)(pBVar25 + uVar16) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar24,iStart);
              uVar16 = (int)local_128 + 1;
              if (uVar16 == 0) goto LAB_0012a043;
              if (sVar18 < 0xfffffffffffffffc) {
                uVar32 = 0x1f;
                if (uVar16 != 0) {
                  for (; uVar16 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                  }
                }
                if ((int)((uVar32 ^ 0x1f) + (int)local_108 * 3 + -0x1e) <
                    (int)(BYTE *)(sVar18 + 4) * 3) {
                  local_128 = 0;
                  local_108 = (BYTE *)(sVar18 + 4);
                  local_78 = puVar23;
                }
              }
            }
          }
          uVar16 = (ms->cParams).minMatch;
          iVar33 = (int)puVar23;
          if (uVar16 - 6 < 2) {
            uVar37 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar25 = (ms->window).base;
            uVar32 = iVar33 - (int)pBVar25;
            uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar17 = (ms->window).lowLimit;
            UVar30 = uVar32 - uVar16;
            if (uVar32 - UVar17 <= uVar16) {
              UVar30 = UVar17;
            }
            pUVar11 = ms->chainTable;
            pBVar21 = (ms->window).dictBase;
            uVar16 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              UVar30 = UVar17;
            }
            uVar22 = uVar32 - uVar37;
            if (uVar32 < uVar37) {
              uVar22 = 0;
            }
            uVar38 = (ms->cParams).searchLog;
            UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar23,6);
            if (UVar17 <= UVar30) goto LAB_00129b9b;
            iVar33 = 1 << ((byte)uVar38 & 0x1f);
            local_130 = 999999999;
            pBVar28 = (BYTE *)0x3;
            do {
              if (UVar17 < uVar16) {
                if (pBVar21 + uVar16 < pBVar21 + (ulong)UVar17 + 4) goto LAB_0012a024;
                if (*(int *)(pBVar21 + UVar17) == *(int *)puVar23) {
                  sVar18 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar34 + 5),pBVar21 + (ulong)UVar17 + 4,
                                      (BYTE *)iEnd,pBVar21 + uVar16,pBVar25 + uVar16);
                  pBVar19 = (BYTE *)(sVar18 + 4);
                }
                else {
LAB_001295d2:
                  pBVar19 = (BYTE *)0x0;
                }
              }
              else {
                puVar24 = (ulong *)(pBVar25 + UVar17);
                if (pBVar28[(long)puVar24] != *(BYTE *)((long)puVar23 + (long)pBVar28))
                goto LAB_001295d2;
                puVar27 = puVar23;
                if (puVar23 < puVar1) {
                  uVar20 = *puVar23 ^ *puVar24;
                  uVar31 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  pBVar19 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
                  puVar27 = (ulong *)((long)puVar34 + 9);
                  if (*puVar24 == *puVar23) {
                    do {
                      puVar24 = puVar24 + 1;
                      if (puVar1 <= puVar27) goto LAB_001295d9;
                      uVar31 = *puVar27;
                      uVar35 = uVar31 ^ *puVar24;
                      uVar20 = 0;
                      if (uVar35 != 0) {
                        for (; (uVar35 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                        }
                      }
                      pBVar19 = (BYTE *)((long)puVar27 +
                                        ((uVar20 >> 3 & 0x1fffffff) - (long)puVar23));
                      puVar27 = puVar27 + 1;
                    } while (*puVar24 == uVar31);
                  }
                }
                else {
LAB_001295d9:
                  if ((puVar27 < puVar2) && ((int)*puVar24 == (int)*puVar27)) {
                    puVar27 = (ulong *)((long)puVar27 + 4);
                    puVar24 = (ulong *)((long)puVar24 + 4);
                  }
                  if ((puVar27 < puVar3) && ((short)*puVar24 == (short)*puVar27)) {
                    puVar27 = (ulong *)((long)puVar27 + 2);
                    puVar24 = (ulong *)((long)puVar24 + 2);
                  }
                  if (puVar27 < iEnd) {
                    puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar27));
                  }
                  pBVar19 = (BYTE *)((long)puVar27 - (long)puVar23);
                }
              }
              if ((pBVar28 < pBVar19) &&
                 (local_130 = (ulong)((uVar32 + 2) - UVar17), pBVar28 = pBVar19,
                 (ulong *)((long)puVar23 + (long)pBVar19) == iEnd)) {
                bVar13 = false;
              }
              else {
                pBVar19 = pBVar28;
                if (uVar22 < UVar17) {
                  UVar17 = pUVar11[UVar17 & uVar37 - 1];
                  bVar13 = true;
                }
                else {
                  bVar13 = false;
                }
              }
            } while (((bVar13) && (UVar30 < UVar17)) &&
                    (iVar33 = iVar33 + -1, pBVar28 = pBVar19, iVar33 != 0));
          }
          else if (uVar16 == 5) {
            uVar32 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar25 = (ms->window).base;
            uVar37 = iVar33 - (int)pBVar25;
            uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar17 = (ms->window).lowLimit;
            UVar30 = uVar37 - uVar16;
            if (uVar37 - UVar17 <= uVar16) {
              UVar30 = UVar17;
            }
            pUVar11 = ms->chainTable;
            pBVar21 = (ms->window).dictBase;
            uVar16 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              UVar30 = UVar17;
            }
            uVar22 = uVar37 - uVar32;
            if (uVar37 < uVar32) {
              uVar22 = 0;
            }
            uVar38 = (ms->cParams).searchLog;
            UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar23,5);
            if (UVar30 < UVar17) {
              iVar33 = 1 << ((byte)uVar38 & 0x1f);
              local_130 = 999999999;
              pBVar28 = (BYTE *)0x3;
              do {
                if (UVar17 < uVar16) {
                  if (pBVar21 + uVar16 < pBVar21 + (ulong)UVar17 + 4) goto LAB_0012a024;
                  if (*(int *)(pBVar21 + UVar17) == *(int *)puVar23) {
                    sVar18 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar34 + 5),pBVar21 + (ulong)UVar17 + 4,
                                        (BYTE *)iEnd,pBVar21 + uVar16,pBVar25 + uVar16);
                    pBVar19 = (BYTE *)(sVar18 + 4);
                  }
                  else {
LAB_00129866:
                    pBVar19 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar24 = (ulong *)(pBVar25 + UVar17);
                  if (pBVar28[(long)puVar24] != *(BYTE *)((long)puVar23 + (long)pBVar28))
                  goto LAB_00129866;
                  puVar27 = puVar23;
                  if (puVar23 < puVar1) {
                    uVar20 = *puVar23 ^ *puVar24;
                    uVar31 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                      }
                    }
                    pBVar19 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
                    puVar27 = (ulong *)((long)puVar34 + 9);
                    if (*puVar24 == *puVar23) {
                      do {
                        puVar24 = puVar24 + 1;
                        if (puVar1 <= puVar27) goto LAB_0012986d;
                        uVar31 = *puVar27;
                        uVar35 = uVar31 ^ *puVar24;
                        uVar20 = 0;
                        if (uVar35 != 0) {
                          for (; (uVar35 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                          }
                        }
                        pBVar19 = (BYTE *)((long)puVar27 +
                                          ((uVar20 >> 3 & 0x1fffffff) - (long)puVar23));
                        puVar27 = puVar27 + 1;
                      } while (*puVar24 == uVar31);
                    }
                  }
                  else {
LAB_0012986d:
                    if ((puVar27 < puVar2) && ((int)*puVar24 == (int)*puVar27)) {
                      puVar27 = (ulong *)((long)puVar27 + 4);
                      puVar24 = (ulong *)((long)puVar24 + 4);
                    }
                    if ((puVar27 < puVar3) && ((short)*puVar24 == (short)*puVar27)) {
                      puVar27 = (ulong *)((long)puVar27 + 2);
                      puVar24 = (ulong *)((long)puVar24 + 2);
                    }
                    if (puVar27 < iEnd) {
                      puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar27))
                      ;
                    }
                    pBVar19 = (BYTE *)((long)puVar27 - (long)puVar23);
                  }
                }
                if ((pBVar28 < pBVar19) &&
                   (local_130 = (ulong)((uVar37 + 2) - UVar17), pBVar28 = pBVar19,
                   (ulong *)((long)puVar23 + (long)pBVar19) == iEnd)) {
                  bVar13 = false;
                }
                else {
                  pBVar19 = pBVar28;
                  if (uVar22 < UVar17) {
                    UVar17 = pUVar11[UVar17 & uVar32 - 1];
                    bVar13 = true;
                  }
                  else {
                    bVar13 = false;
                  }
                }
              } while (((bVar13) && (UVar30 < UVar17)) &&
                      (iVar33 = iVar33 + -1, pBVar28 = pBVar19, iVar33 != 0));
            }
            else {
LAB_00129b9b:
              pBVar19 = (BYTE *)0x3;
              local_130 = 999999999;
            }
          }
          else {
            uVar38 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar25 = (ms->window).base;
            uVar22 = iVar33 - (int)pBVar25;
            uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar16 = (ms->window).lowLimit;
            uVar32 = uVar22 - uVar37;
            if (uVar22 - uVar16 <= uVar37) {
              uVar32 = uVar16;
            }
            pUVar11 = ms->chainTable;
            pBVar21 = (ms->window).dictBase;
            uVar37 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar32 = uVar16;
            }
            uVar16 = uVar22 - uVar38;
            if (uVar22 < uVar38) {
              uVar16 = 0;
            }
            uVar8 = (ms->cParams).searchLog;
            UVar17 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar23,4);
            if (UVar17 <= uVar32) goto LAB_00129b9b;
            iVar33 = 1 << ((byte)uVar8 & 0x1f);
            local_130 = 999999999;
            pBVar28 = (BYTE *)0x3;
            do {
              if (UVar17 < uVar37) {
                if (pBVar21 + uVar37 < pBVar21 + (ulong)UVar17 + 4) goto LAB_0012a024;
                if (*(int *)(pBVar21 + UVar17) == *(int *)puVar23) {
                  sVar18 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar34 + 5),pBVar21 + (ulong)UVar17 + 4,
                                      (BYTE *)iEnd,pBVar21 + uVar37,pBVar25 + uVar37);
                  pBVar19 = (BYTE *)(sVar18 + 4);
                }
                else {
LAB_00129af2:
                  pBVar19 = (BYTE *)0x0;
                }
              }
              else {
                puVar24 = (ulong *)(pBVar25 + UVar17);
                if (pBVar28[(long)puVar24] != *(BYTE *)((long)puVar23 + (long)pBVar28))
                goto LAB_00129af2;
                puVar27 = puVar23;
                if (puVar23 < puVar1) {
                  uVar20 = *puVar23 ^ *puVar24;
                  uVar31 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  pBVar19 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
                  puVar27 = (ulong *)((long)puVar34 + 9);
                  if (*puVar24 == *puVar23) {
                    do {
                      puVar24 = puVar24 + 1;
                      if (puVar1 <= puVar27) goto LAB_00129af9;
                      uVar31 = *puVar27;
                      uVar35 = uVar31 ^ *puVar24;
                      uVar20 = 0;
                      if (uVar35 != 0) {
                        for (; (uVar35 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                        }
                      }
                      pBVar19 = (BYTE *)((long)puVar27 +
                                        ((uVar20 >> 3 & 0x1fffffff) - (long)puVar23));
                      puVar27 = puVar27 + 1;
                    } while (*puVar24 == uVar31);
                  }
                }
                else {
LAB_00129af9:
                  if ((puVar27 < puVar2) && ((int)*puVar24 == (int)*puVar27)) {
                    puVar27 = (ulong *)((long)puVar27 + 4);
                    puVar24 = (ulong *)((long)puVar24 + 4);
                  }
                  if ((puVar27 < puVar3) && ((short)*puVar24 == (short)*puVar27)) {
                    puVar27 = (ulong *)((long)puVar27 + 2);
                    puVar24 = (ulong *)((long)puVar24 + 2);
                  }
                  if (puVar27 < iEnd) {
                    puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar27));
                  }
                  pBVar19 = (BYTE *)((long)puVar27 - (long)puVar23);
                }
              }
              if ((pBVar28 < pBVar19) &&
                 (local_130 = (ulong)((uVar22 + 2) - UVar17), pBVar28 = pBVar19,
                 (ulong *)((long)puVar23 + (long)pBVar19) == iEnd)) {
                bVar13 = false;
              }
              else {
                pBVar19 = pBVar28;
                if (uVar16 < UVar17) {
                  UVar17 = pUVar11[UVar17 & uVar38 - 1];
                  bVar13 = true;
                }
                else {
                  bVar13 = false;
                }
              }
            } while (((bVar13) && (uVar32 < UVar17)) &&
                    (iVar33 = iVar33 + -1, pBVar28 = pBVar19, iVar33 != 0));
          }
          uVar16 = (int)local_130 + 1;
          if ((uVar16 == 0) || (uVar32 = (int)local_128 + 1, uVar32 == 0)) {
LAB_0012a043:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x12c2,"U32 ZSTD_highbit32(U32)");
          }
          bVar13 = true;
          if ((BYTE *)0x3 < pBVar19) {
            iVar33 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> iVar33 == 0; iVar33 = iVar33 + -1) {
              }
            }
            uVar16 = 0x1f;
            if (uVar32 != 0) {
              for (; uVar32 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            if ((int)((uVar16 ^ 0x1f) + (int)local_108 * 4 + -0x1b) < (int)pBVar19 * 4 - iVar33) {
              bVar13 = false;
              local_128 = local_130;
              local_78 = puVar23;
              local_108 = pBVar19;
            }
          }
          puVar34 = puVar23;
        } while (!bVar13);
        if (local_128 == 0) {
          UVar30 = 1;
          UVar17 = UVar39;
        }
        else {
          pBVar28 = (BYTE *)((long)local_78 + (2 - (long)(pBVar9 + local_128)));
          pBVar21 = iStart;
          pBVar25 = pBVar9;
          if ((uint)pBVar28 < uVar6) {
            pBVar21 = pBVar10 + uVar7;
            pBVar25 = pBVar10;
          }
          if ((local_d8 < local_78) &&
             (uVar31 = (ulong)pBVar28 & 0xffffffff, pBVar21 < pBVar25 + uVar31)) {
            pBVar25 = pBVar25 + uVar31;
            do {
              puVar34 = (ulong *)((long)local_78 + -1);
              pBVar25 = pBVar25 + -1;
              if ((*(BYTE *)puVar34 != *pBVar25) ||
                 (local_108 = local_108 + 1, local_78 = puVar34, puVar34 <= local_d8)) break;
            } while (pBVar21 < pBVar25);
          }
          UVar30 = (int)local_128 + 1;
          UVar17 = (int)local_128 - 2;
          UVar36 = UVar39;
        }
        UVar39 = UVar17;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0012a062:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_0012a081:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar31 = (long)local_78 - (long)local_d8;
        puVar34 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar34 + uVar31)) {
LAB_0012a0bf:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < local_78) {
LAB_0012a0a0:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < local_78) {
          ZSTD_safecopyLiterals((BYTE *)puVar34,(BYTE *)local_d8,(BYTE *)local_78,(BYTE *)ilimit_w);
        }
        else {
          uVar20 = local_d8[1];
          *puVar34 = *local_d8;
          puVar34[1] = uVar20;
          if (0x10 < uVar31) {
            pBVar25 = seqStore->lit;
            puVar34 = (ulong *)(pBVar25 + 0x10);
            puVar23 = local_d8 + 2;
            if (0xffffffffffffffe8 < (ulong)((long)puVar34 + (-8 - (long)puVar23))) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (0xffffffffffffffe0 < (ulong)((long)puVar34 + (-0x10 - (long)puVar23))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar20 = local_d8[3];
            *puVar34 = *puVar23;
            *(ulong *)(pBVar25 + 0x18) = uVar20;
            if (0x20 < (long)uVar31) {
              lVar29 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_d8 + lVar29 + 0x20);
                uVar14 = puVar5[1];
                pBVar21 = pBVar25 + lVar29 + 0x20;
                *(undefined8 *)pBVar21 = *puVar5;
                *(undefined8 *)(pBVar21 + 8) = uVar14;
                puVar5 = (undefined8 *)((long)local_d8 + lVar29 + 0x30);
                uVar14 = puVar5[1];
                *(undefined8 *)(pBVar21 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar21 + 0x18) = uVar14;
                lVar29 = lVar29 + 0x20;
              } while (pBVar21 + 0x20 < pBVar25 + uVar31);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar31;
        if (0xffff < uVar31) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12 = seqStore->sequences;
        psVar12->litLength = (U16)uVar31;
        psVar12->offset = UVar30;
        if ((BYTE *)0xffff < local_108 + -3) {
          if (seqStore->longLengthID != 0) {
LAB_0012a0de:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->matchLength = (U16)(local_108 + -3);
        seqStore->sequences = psVar12 + 1;
        puVar34 = (ulong *)((long)local_78 + (long)local_108);
        local_d8 = puVar34;
        do {
          if (puVar4 < puVar34) break;
          uVar16 = (uint)((long)puVar34 - (long)(pBVar9 + UVar36));
          pBVar25 = pBVar9;
          if (uVar16 < uVar6) {
            pBVar25 = pBVar10;
          }
          if ((uVar7 < uVar16 && 2 < iVar15 - uVar16) &&
             ((int)*puVar34 ==
              *(int *)(pBVar25 + ((long)puVar34 - (long)(pBVar9 + UVar36) & 0xffffffff)))) {
            puVar23 = iEnd;
            if (uVar16 < uVar6) {
              puVar23 = puVar26;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar34 + 4),
                                (BYTE *)((long)(pBVar25 +
                                               ((long)puVar34 - (long)(pBVar9 + UVar36) & 0xffffffff
                                               )) + 4),(BYTE *)iEnd,(BYTE *)puVar23,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0012a062;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0012a081;
            puVar23 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar23) goto LAB_0012a0bf;
            if (iEnd < local_d8) goto LAB_0012a0a0;
            if (ilimit_w < local_d8) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar23,(BYTE *)local_d8,(BYTE *)local_d8,(BYTE *)ilimit_w);
            }
            else {
              uVar31 = local_d8[1];
              *puVar23 = *local_d8;
              puVar23[1] = uVar31;
            }
            psVar12 = seqStore->sequences;
            psVar12->litLength = 0;
            psVar12->offset = 1;
            if (0xffff < sVar18 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_0012a0de;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12->matchLength = (U16)(sVar18 + 1);
            seqStore->sequences = psVar12 + 1;
            puVar34 = (ulong *)((long)puVar34 + sVar18 + 4);
            bVar13 = true;
            UVar17 = UVar39;
            UVar39 = UVar36;
            local_d8 = puVar34;
          }
          else {
            bVar13 = false;
            UVar17 = UVar36;
          }
          UVar36 = UVar17;
        } while (bVar13);
      }
    } while (puVar34 < puVar4);
  }
  *rep = UVar39;
  rep[1] = UVar36;
  return (long)iEnd - (long)local_d8;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}